

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O2

void __thiscall ConvexH::ConvexH(ConvexH *this,int vertices_size,int edges_size,int facets_size)

{
  cbtPlane local_3c;
  
  (this->vertices).m_ownsMemory = true;
  (this->vertices).m_data = (cbtVector3 *)0x0;
  (this->vertices).m_size = 0;
  (this->vertices).m_capacity = 0;
  (this->edges).m_ownsMemory = true;
  (this->edges).m_data = (HalfEdge *)0x0;
  (this->edges).m_size = 0;
  (this->edges).m_capacity = 0;
  (this->facets).m_ownsMemory = true;
  (this->facets).m_data = (cbtPlane *)0x0;
  (this->facets).m_size = 0;
  (this->facets).m_capacity = 0;
  cbtAlignedObjectArray<cbtVector3>::resize(&this->vertices,vertices_size,&local_3c.normal);
  cbtAlignedObjectArray<ConvexH::HalfEdge>::resize(&this->edges,edges_size,(HalfEdge *)&local_3c);
  local_3c.dist = 0.0;
  cbtAlignedObjectArray<cbtPlane>::resize(&this->facets,facets_size,&local_3c);
  return;
}

Assistant:

ConvexH::ConvexH(int vertices_size, int edges_size, int facets_size)
{
	vertices.resize(vertices_size);
	edges.resize(edges_size);
	facets.resize(facets_size);
}